

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestValidate.c
# Opt level: O1

void RDL_validate(RDL_data *data,RDL_DimacsGraph *dimacs_graph,int timeout,int *urf_result,
                 int *basis_result)

{
  int *piVar1;
  size_t __size;
  char **ppcVar2;
  undefined4 *puVar3;
  RDL_data *pRVar4;
  RDL_DimacsGraph *__ptr;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  uint uVar8;
  void *pvVar9;
  void *__ptr_00;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  RDL_cycle **cycle_array;
  char **other_cycle_array;
  char **basis_cycle_array;
  long local_90;
  void *local_88;
  int *local_80;
  int local_74;
  ulong local_70;
  void *local_68;
  RDL_data *local_60;
  RDL_DimacsGraph *local_58;
  ulong local_50;
  void *local_48;
  int *local_40;
  undefined8 local_38;
  
  iVar15 = 0;
  *urf_result = 0;
  *basis_result = 0;
  local_80 = urf_result;
  local_74 = timeout;
  local_58 = dimacs_graph;
  local_40 = basis_result;
  uVar5 = RDL_getRCycles(data,&local_90);
  uVar13 = (ulong)uVar5;
  RDL_deleteCycles(local_90,uVar5);
  local_88 = (void *)(uVar13 * 8);
  pvVar9 = malloc((size_t)local_88);
  local_50 = uVar13;
  __ptr_00 = malloc(uVar13 * 4);
  iVar6 = RDL_getNofURF(data);
  local_70 = RDL_getNofEdges(data);
  local_60 = data;
  if (iVar6 != 0) {
    iVar11 = 0;
    do {
      uVar7 = RDL_getRCyclesForURF(data,iVar15,&local_90);
      uVar5 = RDL_translateCycArray(data,local_90,uVar7,&local_48);
      RDL_deleteCycles(local_90);
      data = local_60;
      if (uVar5 != 0) {
        uVar13 = 0;
        do {
          uVar12 = (ulong)(uint)(iVar11 + (int)uVar13);
          *(undefined8 *)((long)pvVar9 + uVar12 * 8) = *(undefined8 *)((long)local_48 + uVar13 * 8);
          *(int *)((long)__ptr_00 + uVar12 * 4) = iVar15;
          uVar13 = uVar13 + 1;
        } while (uVar5 != uVar13);
        iVar11 = iVar11 + (int)uVar13;
      }
      free(local_48);
      iVar15 = iVar15 + 1;
    } while (iVar15 != iVar6);
  }
  local_88 = malloc((size_t)local_88);
  uVar13 = local_50;
  uVar12 = local_70 & 0xffffffff;
  if (local_50 != 0) {
    local_68 = (void *)(ulong)((int)local_70 + 1);
    uVar14 = 0;
    do {
      pvVar10 = malloc((size_t)local_68);
      *(void **)((long)local_88 + uVar14 * 8) = pvVar10;
      memcpy(pvVar10,*(void **)((long)pvVar9 + uVar14 * 8),uVar12);
      *(undefined1 *)((long)pvVar10 + uVar12) = 2;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  qsort(local_88,uVar13,8,RDL_cmp_cycles);
  if (local_58->nof_cycles == 0xffffffff) {
    RDL_validate_cold_2();
  }
  else if ((uint)uVar13 == local_58->nof_cycles) {
    if (uVar13 != 0) {
      ppcVar2 = local_58->sorted_cycles;
      uVar14 = 0;
      do {
        iVar6 = bcmp(*(void **)((long)local_88 + uVar14 * 8),ppcVar2[uVar14],uVar12);
        if (iVar6 != 0) {
          RDL_validate_cold_1();
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
  }
  else {
    fprintf(_stderr,"different number of relevant cycles %u vs %u!\n",uVar13 & 0xffffffff);
    *local_80 = 1;
  }
  piVar1 = local_80;
  if (*local_80 == 0) {
    RDL_timeout_stop_fun(&local_74);
    iVar6 = RDL_validateRingFamilies
                      (pvVar9,__ptr_00,uVar13 & 0xffffffff,local_70,RDL_timeout_stop_fun);
    *piVar1 = iVar6;
  }
  pRVar4 = local_60;
  uVar5 = RDL_getSSSR(local_60);
  local_58 = (RDL_DimacsGraph *)malloc((ulong)uVar5 * 4);
  uVar13 = (ulong)pRVar4->bccGraphs->nof_bcc;
  __size = uVar13 * 4;
  pvVar10 = malloc(__size);
  if (uVar13 != 0) {
    memset(pvVar10,0,__size);
  }
  __ptr = local_58;
  pRVar4 = local_60;
  local_80 = (int *)CONCAT44(local_80._4_4_,uVar5);
  local_68 = pvVar10;
  if (uVar5 != 0) {
    uVar13 = 0;
    do {
      puVar3 = (undefined4 *)**(undefined8 **)(local_90 + uVar13 * 8);
      uVar8 = RDL_getEdgeId(pRVar4,*puVar3,puVar3[1]);
      uVar8 = *pRVar4->bccGraphs->edge_to_bcc_mapping[uVar8];
      piVar1 = (int *)((long)local_68 + (ulong)uVar8 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)((long)__ptr + uVar13 * 4) = uVar8;
      uVar13 = uVar13 + 1;
    } while (uVar5 != uVar13);
  }
  piVar1 = local_80;
  RDL_translateCycArray(pRVar4,local_90,(ulong)local_80 & 0xffffffff);
  RDL_deleteCycles(local_90,(ulong)piVar1 & 0xffffffff);
  RDL_timeout_stop_fun(&local_74);
  uVar13 = local_50;
  iVar6 = RDL_validateBasis(pvVar9,local_50 & 0xffffffff,local_38,(ulong)piVar1 & 0xffffffff,
                            local_70,__ptr,RDL_timeout_stop_fun);
  *local_40 = iVar6;
  free(__ptr);
  free(__ptr_00);
  free(local_68);
  RDL_deleteEdgeIdxArray(pvVar9,uVar13 & 0xffffffff);
  RDL_deleteEdgeIdxArray(local_38,(ulong)piVar1 & 0xffffffff);
  RDL_deleteEdgeIdxArray(local_88,uVar13 & 0xffffffff);
  return;
}

Assistant:

void RDL_validate(RDL_data* data, RDL_DimacsGraph* dimacs_graph, int timeout,
                  int* urf_result, int* basis_result)
{
  unsigned URFcount, idx, weight, nof_relevant, curr_bcc,
    running_idx, idx2, nof_edges, nof_basis, edge, max_nof_basis_bcc=0;
  RDL_cycle **cycle_array;
  char **other_cycle_array, **final_cycle_array, **sortable_cycle_array, **basis_cycle_array;
  unsigned *urf_numbers, *bcc, *nof_basis_bcc;

  *urf_result = 0;
  *basis_result = 0;

  nof_relevant = RDL_getRCycles(data, &cycle_array);
  RDL_deleteCycles(cycle_array, nof_relevant);

  final_cycle_array = malloc(nof_relevant * sizeof(*final_cycle_array));
  urf_numbers = malloc(nof_relevant * sizeof(*urf_numbers));

  URFcount = RDL_getNofURF(data);

  nof_edges = RDL_getNofEdges(data);

  for (idx = 0, running_idx = 0; idx < URFcount; ++idx) {
    weight = RDL_getRCyclesForURF(data, idx,  &cycle_array);
    weight = RDL_translateCycArray(data, cycle_array, weight, &other_cycle_array);
    RDL_deleteCycles(cycle_array, weight);

    for (idx2 = 0; idx2 < weight; ++idx2, ++running_idx) {
      final_cycle_array[running_idx] = other_cycle_array[idx2];
      urf_numbers[running_idx] = idx;

    }

    free(other_cycle_array);
  }


  sortable_cycle_array = malloc(nof_relevant * sizeof(*sortable_cycle_array));
  for (idx = 0; idx < nof_relevant; ++idx) {
    sortable_cycle_array[idx] = malloc((nof_edges + 1) * sizeof(**sortable_cycle_array));
    memcpy(sortable_cycle_array[idx], final_cycle_array[idx], nof_edges * sizeof(**sortable_cycle_array));
    sortable_cycle_array[idx][nof_edges] = 2;
  }

  qsort(sortable_cycle_array, nof_relevant, sizeof(*sortable_cycle_array), RDL_cmp_cycles);

  if (dimacs_graph->nof_cycles == UINT_MAX) {
    fprintf(stderr, "skipping RC test, no RCs in input file...\n");
  }
  else if (nof_relevant != dimacs_graph->nof_cycles) {
    fprintf(stderr, "different number of relevant cycles %u vs %u!\n",
        nof_relevant, dimacs_graph->nof_cycles);
    *urf_result = 1;
  }
  else {
    for (idx = 0; idx < nof_relevant; ++idx) {
      if (memcmp(sortable_cycle_array[idx], dimacs_graph->sorted_cycles[idx],
          nof_edges * sizeof(**sortable_cycle_array))) {
        fprintf(stderr, "relevant cycle mismatch found!\n");
        *urf_result = 1;
        break;
      }
    }
  }

  if (!*urf_result) {
    RDL_timeout_stop_fun(&timeout);

    *urf_result = RDL_validateRingFamilies((const char**)final_cycle_array, urf_numbers,
        nof_relevant, nof_edges, RDL_timeout_stop_fun);
  }

  nof_basis = RDL_getSSSR(data, &cycle_array);

  bcc = malloc(nof_basis * sizeof(*bcc));
  nof_basis_bcc = malloc(data->bccGraphs->nof_bcc * sizeof(*nof_basis_bcc));
  for (idx = 0; idx < data->bccGraphs->nof_bcc; ++idx) {
    nof_basis_bcc[idx] = 0;
  }
  for (idx = 0; idx < nof_basis; ++idx) {
    edge = RDL_getEdgeId(data, cycle_array[idx]->edges[0][0],
        cycle_array[idx]->edges[0][1]);
    curr_bcc = data->bccGraphs->edge_to_bcc_mapping[edge][0];
    bcc[idx] = curr_bcc;
    ++nof_basis_bcc[curr_bcc];
    max_nof_basis_bcc = nof_basis_bcc[curr_bcc] > max_nof_basis_bcc ? nof_basis_bcc[curr_bcc] : max_nof_basis_bcc;
  }

  RDL_translateCycArray(data, cycle_array, nof_basis, &basis_cycle_array);
  RDL_deleteCycles(cycle_array, nof_basis);

  RDL_timeout_stop_fun(&timeout);
  *basis_result = RDL_validateBasis(
      (const char**)final_cycle_array, nof_relevant,
      (const char**)basis_cycle_array, nof_basis,
      nof_edges, bcc, RDL_timeout_stop_fun);
  free(bcc);
  free(urf_numbers);
  free(nof_basis_bcc);

  RDL_deleteEdgeIdxArray(final_cycle_array, nof_relevant);
  RDL_deleteEdgeIdxArray(basis_cycle_array, nof_basis);
  RDL_deleteEdgeIdxArray(sortable_cycle_array, nof_relevant);
}